

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::LoopBreakLayerParams::_InternalSerialize
          (LoopBreakLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  int size;
  ulong uVar1;
  uint8_t *puVar2;
  size_t __n;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = uVar1 & 0xfffffffffffffffc;
    data = *(void **)(uVar1 + 8);
    size = (int)*(undefined8 *)(uVar1 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar2;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* LoopBreakLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.LoopBreakLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.LoopBreakLayerParams)
  return target;
}